

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall iDynTree::Model::isFrameNameUsed(Model *this,string *frameName)

{
  __type _Var1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar2 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
    uVar5 = uVar5 + 1;
    if (uVar2 <= uVar5) {
      uVar5 = uVar2 - 1;
      lVar4 = uVar2 << 5;
      do {
        sVar3 = getNrOfFrames(this);
        uVar5 = uVar5 + 1;
        bVar6 = uVar5 < sVar3;
        if (!bVar6) {
          return bVar6;
        }
        _Var1 = std::operator==(frameName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(this->frameNames).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [((long)(this->links).
                                                 super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->links).
                                                super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                                ._M_impl.super__Vector_impl_data._M_start) / -0x70].
                                         _M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + 0x20;
      } while (!_Var1);
      return bVar6;
    }
    _Var1 = std::operator==(frameName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->linkNames).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4));
    lVar4 = lVar4 + 0x20;
  } while (!_Var1);
  return true;
}

Assistant:

bool Model::isFrameNameUsed(const std::string frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return true;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return true;
        }
    }

    return false;
}